

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O3

int CVodeGetNumNonlinSolvIters(void *cvode_mem,long *nniters)

{
  int iVar1;
  
  if (cvode_mem == (void *)0x0) {
    iVar1 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeGetNumNonlinSolvIters",
                   "cvode_mem = NULL illegal.");
  }
  else {
    *nniters = *(long *)((long)cvode_mem + 0x370);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeGetNumNonlinSolvIters(void *cvode_mem, long int *nniters)
{
  CVodeMem cv_mem;

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE",
                   "CVodeGetNumNonlinSolvIters", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  *nniters = cv_mem->cv_nni;

  return(CV_SUCCESS);
}